

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::LineRenderCase::checkAreaNumLines
          (LineRenderCase *this,ConstPixelBufferAccess *access,IVec4 *area,int *messageLimitCounter,
          int componentNdx,IVec2 *numLines)

{
  ostringstream *poVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int z;
  int x;
  int y;
  ConstPixelBufferAccess subAccess;
  MessageBuilder local_1b0;
  
  iVar7 = 0;
  tcu::getSubregion(&subAccess,access,area->m_data[0],area->m_data[1],0,area->m_data[2],
                    area->m_data[3],1);
  iVar5 = -1;
  uVar8 = 0;
  for (z = 0; z < subAccess.m_size.m_data[1]; z = z + 1) {
    y = 0;
    while( true ) {
      if (subAccess.m_size.m_data[0] <= y) break;
      tcu::ConstPixelBufferAccess::getPixelInt
                ((ConstPixelBufferAccess *)&local_1b0,(int)&subAccess,y,z);
      iVar2 = *(int *)((long)&local_1b0.m_log + (long)componentNdx * 4);
      if (iVar5 != -1) {
        uVar6 = 1;
        if (iVar2 == iVar5 || iVar2 < iVar5) {
          uVar6 = -(uint)(iVar2 < iVar5);
        }
        if (((iVar2 != iVar5) && (uVar6 == -uVar8)) || ((iVar2 != iVar5 && (uVar8 == 0)))) {
          uVar8 = -(uint)(iVar2 < iVar5);
          if (iVar5 < iVar2) {
            uVar8 = 1;
          }
          iVar7 = iVar7 + (uint)(iVar2 <= iVar5);
        }
      }
      y = y + 1;
      iVar5 = iVar2;
    }
  }
  iVar7 = iVar7 - ((int)~uVar8 >> 0x1f);
  bVar3 = numLines->m_data[0] <= iVar7;
  bVar4 = iVar7 <= numLines->m_data[1];
  if (!bVar4 || !bVar3) {
    *messageLimitCounter = *messageLimitCounter + -1;
    if (-1 < *messageLimitCounter) {
      if (area->m_data[2] == 1) {
        local_1b0.m_log =
             ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
             m_log;
        poVar1 = &local_1b0.m_str;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        std::operator<<((ostream *)poVar1,"On column ");
        std::ostream::operator<<(poVar1,area->m_data[0]);
        std::operator<<((ostream *)poVar1,", y: [");
        std::ostream::operator<<(poVar1,area->m_data[1]);
        std::operator<<((ostream *)poVar1,",");
        std::ostream::operator<<(poVar1,area->m_data[3] + area->m_data[1]);
        std::operator<<((ostream *)poVar1,"):\n");
        std::operator<<((ostream *)poVar1,"\tExpected [");
        std::ostream::operator<<(poVar1,numLines->m_data[0]);
        std::operator<<((ostream *)poVar1,", ");
        std::ostream::operator<<(poVar1,numLines->m_data[1]);
        std::operator<<((ostream *)poVar1,"] lines but the number of lines in the area is ");
        std::ostream::operator<<(poVar1,iVar7);
        tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        local_1b0.m_log =
             ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
             m_log;
        poVar1 = &local_1b0.m_str;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        std::operator<<((ostream *)poVar1,"On row ");
        std::ostream::operator<<(poVar1,area->m_data[1]);
        std::operator<<((ostream *)poVar1,", x: [");
        std::ostream::operator<<(poVar1,area->m_data[0]);
        std::operator<<((ostream *)poVar1,",");
        std::ostream::operator<<(poVar1,area->m_data[2] + area->m_data[0]);
        std::operator<<((ostream *)poVar1,"):\n");
        std::operator<<((ostream *)poVar1,"\tExpected [");
        std::ostream::operator<<(poVar1,numLines->m_data[0]);
        std::operator<<((ostream *)poVar1,", ");
        std::ostream::operator<<(poVar1,numLines->m_data[1]);
        std::operator<<((ostream *)poVar1,"] lines but the number of lines in the area is ");
        std::ostream::operator<<(poVar1,iVar7);
        tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
    }
  }
  return bVar4 && bVar3;
}

Assistant:

bool LineRenderCase::checkAreaNumLines (const tcu::ConstPixelBufferAccess& access, const tcu::IVec4& area, int& messageLimitCounter, int componentNdx, const tcu::IVec2& numLines) const
{
	// Num maxima == num lines
	const tcu::ConstPixelBufferAccess	subAccess		= tcu::getSubregion(access, area.x(), area.y(), 0, area.z(), area.w(), 1);
	const tcu::IVec2					numMinimaMaxima	= getNumMinimaMaxima(subAccess, componentNdx);
	const int							numMaxima		= numMinimaMaxima.y();

	// In valid range
	if (numMaxima >= numLines.x() && numMaxima <= numLines.y())
		return true;

	if (--messageLimitCounter < 0)
		return false;

	if (area.z() == 1)
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "On column " << area.x() << ", y: [" << area.y() << "," << (area.y()+area.w()) << "):\n"
				<< "\tExpected [" << numLines.x() << ", " << numLines.y() << "] lines but the number of lines in the area is " << numMaxima
			<< tcu::TestLog::EndMessage;
	else
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "On row " << area.y() << ", x: [" << area.x() << "," << (area.x()+area.z()) << "):\n"
				<< "\tExpected [" << numLines.x() << ", " << numLines.y() << "] lines but the number of lines in the area is " << numMaxima
			<< tcu::TestLog::EndMessage;

	return false;
}